

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThriftSenderTest.cpp
# Opt level: O3

void __thiscall
jaegertracing::ThriftSender_testExceptions_Test::TestBody(ThriftSender_testExceptions_Test *this)

{
  char cVar1;
  UDPTransporter *this_00;
  string_view name;
  undefined1 local_358 [40];
  char *local_330;
  shared_ptr<const_jaegertracing::Tracer> tracer;
  vector<jaegertracing::Reference,_std::allocator<jaegertracing::Reference>_> local_318;
  undefined8 local_300;
  shared_ptr<jaegertracing::testutils::TracerUtil::ResourceHandle> handle;
  time_point local_2e8;
  time_point local_2e0;
  IPAddress local_2d8;
  MockThriftSender mockSender;
  Span span;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_198;
  
  jaegertracing::testutils::TracerUtil::installGlobalTracer();
  opentracing::v3::Tracer::Global();
  tracer.super___shared_ptr<const_jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = _span;
  tracer.super___shared_ptr<const_jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = local_198;
  if (local_198 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_198->_M_use_count = local_198->_M_use_count + 1;
      UNLOCK();
      if (local_198 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_00197ff0;
    }
    else {
      local_198->_M_use_count = local_198->_M_use_count + 1;
    }
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_198);
  }
LAB_00197ff0:
  mockSender._48_8_ = &mockSender.field_0x60;
  mockSender._0_8_ = &PTR__SpanContext_0020a2e8;
  mockSender._8_8_ = 0;
  mockSender._16_8_ = 0;
  mockSender._24_8_ = 0;
  mockSender._32_8_ = 0;
  mockSender._40_1_ = 0;
  mockSender._56_8_ = 1;
  mockSender._64_8_ = 0;
  mockSender._72_8_ = 0;
  mockSender._80_4_ = 0x3f800000;
  mockSender._88_8_ = 0;
  mockSender._96_8_ = 0;
  mockSender._112_8_ = 0;
  mockSender._120_1_ = 0;
  mockSender._136_8_ = 0;
  mockSender._144_8_ = 0;
  local_2d8._addr._0_8_ = (undefined1 *)((long)&local_2d8 + 0x10U);
  mockSender._104_8_ = &mockSender.field_0x78;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"");
  local_2e0.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  local_2e8.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  local_358._16_8_ = (pointer)0x0;
  local_358._0_8_ = (pointer)0x0;
  local_358._8_8_ = (pointer)0x0;
  local_318.super__Vector_base<jaegertracing::Reference,_std::allocator<jaegertracing::Reference>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_318.super__Vector_base<jaegertracing::Reference,_std::allocator<jaegertracing::Reference>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_318.super__Vector_base<jaegertracing::Reference,_std::allocator<jaegertracing::Reference>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  Span::Span(&span,&tracer,(SpanContext *)&mockSender,(string *)&local_2d8,&local_2e0,&local_2e8,
             (vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> *)local_358,&local_318
            );
  std::vector<jaegertracing::Reference,_std::allocator<jaegertracing::Reference>_>::~vector
            (&local_318);
  std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::~vector
            ((vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> *)local_358);
  if ((undefined1 *)local_2d8._addr._0_8_ != (undefined1 *)((long)&local_2d8 + 0x10U)) {
    operator_delete((void *)local_2d8._addr._0_8_);
  }
  mockSender._0_8_ = &PTR__SpanContext_0020a2e8;
  if ((undefined1 *)mockSender._104_8_ != &mockSender.field_0x78) {
    operator_delete((void *)mockSender._104_8_);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&mockSender.field_0x30);
  name.length_ = 4;
  name.data_ = "test";
  Span::SetOperationName(&span,name);
  local_330 = 
  "Expected: mockSender.flush() throws an exception of type Sender::Exception.\n  Actual: it throws nothing."
  ;
  local_300 = 0;
  local_358._0_8_ = (pointer)(local_358 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_358,"localhost","");
  jaegertracing::net::IPAddress::versionFromString((string *)&local_2d8,(int)local_358,0);
  this_00 = (UDPTransporter *)operator_new(200);
  jaegertracing::utils::UDPTransporter::UDPTransporter(this_00,&local_2d8,0);
  (this_00->super_Transport)._vptr_Transport = (_func_int **)&PTR__UDPTransporter_0020b4e0;
  *(undefined4 *)&this_00[1].super_Transport._vptr_Transport = 0;
  local_318.super__Vector_base<jaegertracing::Reference,_std::allocator<jaegertracing::Reference>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)this_00;
  jaegertracing::ThriftSender::ThriftSender(&mockSender.super_ThriftSender,(unique_ptr *)&local_318)
  ;
  if ((UDPTransporter *)
      local_318.
      super__Vector_base<jaegertracing::Reference,_std::allocator<jaegertracing::Reference>_>.
      _M_impl.super__Vector_impl_data._M_start != (UDPTransporter *)0x0) {
    (*((Transport *)
      &(local_318.
        super__Vector_base<jaegertracing::Reference,_std::allocator<jaegertracing::Reference>_>.
        _M_impl.super__Vector_impl_data._M_start)->_spanContext)->_vptr_Transport[1])();
  }
  mockSender._0_8_ = &PTR__ThriftSender_0020b490;
  if ((pointer)local_358._0_8_ != (pointer)(local_358 + 0x10)) {
    operator_delete((void *)local_358._0_8_);
  }
  jaegertracing::ThriftSender::append((Span *)&mockSender.super_ThriftSender);
  cVar1 = testing::internal::AlwaysTrue();
  if (cVar1 != '\0') {
    jaegertracing::ThriftSender::flush();
  }
  testing::Message::Message((Message *)&local_2d8);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_358,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/ThriftSenderTest.cpp"
             ,0x69,local_330);
  testing::internal::AssertHelper::operator=((AssertHelper *)local_358,(Message *)&local_2d8);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_358);
  if ((long *)local_2d8._addr._0_8_ != (long *)0x0) {
    cVar1 = testing::internal::IsTrue(true);
    if ((cVar1 != '\0') && ((long *)local_2d8._addr._0_8_ != (long *)0x0)) {
      (**(code **)(*(long *)local_2d8._addr._0_8_ + 8))();
    }
  }
  ThriftSender::~ThriftSender(&mockSender.super_ThriftSender);
  Span::~Span(&span);
  if (tracer.super___shared_ptr<const_jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (tracer.super___shared_ptr<const_jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (handle.
      super___shared_ptr<jaegertracing::testutils::TracerUtil::ResourceHandle,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (handle.
               super___shared_ptr<jaegertracing::testutils::TracerUtil::ResourceHandle,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

TEST(ThriftSender, testExceptions)
{
    const auto handle = testutils::TracerUtil::installGlobalTracer();
    const auto tracer =
        std::static_pointer_cast<const Tracer>(opentracing::Tracer::Global());

    Span span(tracer);
    span.SetOperationName("test");

    const MockUDPSender::ExceptionType exceptionTypes[] = {
        MockUDPSender::ExceptionType::kSystemError,
        MockUDPSender::ExceptionType::kException,
        MockUDPSender::ExceptionType::kString
    };
    for (auto type : exceptionTypes) {
      MockThriftSender mockSender(net::IPAddress::v4("localhost", 0), 0, type);
      mockSender.append(span);
        ASSERT_THROW(mockSender.flush(), Sender::Exception);
    }
}